

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O0

void __thiscall Cache::setByte(Cache *this,uint32_t addr,uint8_t val,uint32_t *cycles)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  reference pvVar5;
  reference pvVar6;
  int *in_RCX;
  undefined1 in_DL;
  undefined4 in_ESI;
  MemoryManager *in_RDI;
  Cache *unaff_retaddr;
  uint32_t offset_1;
  int tmp;
  uint32_t tag;
  uint32_t set_id;
  bool next_level;
  uint32_t offset;
  int block_id;
  uint32_t *in_stack_00000070;
  uint32_t in_stack_0000007c;
  Cache *in_stack_00000080;
  uint32_t in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb4;
  uint32_t in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  uint local_30;
  undefined4 in_stack_ffffffffffffffe0;
  undefined3 in_stack_fffffffffffffff0;
  undefined4 uVar7;
  value_type vVar8;
  MemoryManager *b;
  
  uVar7 = CONCAT13(in_DL,in_stack_fffffffffffffff0);
  *(int *)in_RDI->memory = *(int *)in_RDI->memory + 1;
  *(int *)(in_RDI->memory + 0xe) = *(int *)(in_RDI->memory + 0xe) + 1;
  b = in_RDI;
  uVar2 = getBlockId((Cache *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     in_stack_ffffffffffffffb4);
  if (uVar2 == 0xffffffff) {
    *(int *)(in_RDI->memory + 0xf) = *(int *)(in_RDI->memory + 0xf) + 1;
    if (((ulong)in_RDI->memory[0] & 0x10000000000) == 0) {
      if (in_RDI->memory[2] == (uint8_t **)0x0) {
        MemoryManager::setByteNoCache
                  (in_RDI,in_stack_ffffffffffffffbc,(uint8_t)(in_stack_ffffffffffffffb8 >> 0x18));
        *(int *)((long)in_RDI->memory + 0x7c) = *(int *)((long)in_RDI->memory + 0x7c) + 100;
        if (in_RCX != (int *)0x0) {
          *in_RCX = *in_RCX + 100;
        }
      }
      else {
        setByte((Cache *)CONCAT44(in_ESI,uVar7),(uint32_t)((ulong)in_RCX >> 0x20),
                (uint8_t)((ulong)in_RCX >> 0x18),
                (uint32_t *)CONCAT44(0xffffffff,in_stack_ffffffffffffffe0));
        if (in_RCX != (int *)0x0) {
          *(int *)((long)in_RDI->memory + 0x7c) = *in_RCX + *(int *)((long)in_RDI->memory + 0x7c);
        }
      }
    }
    else {
      if (((ulong)in_RDI->memory[10] & 1) != 0) {
        getId((Cache *)in_RDI,in_stack_ffffffffffffffbc);
        bVar1 = cacheSetFull((Cache *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                             in_stack_ffffffffffffffb4);
        if (bVar1) {
          bVar1 = true;
          uVar4 = getId((Cache *)in_RDI,in_stack_ffffffffffffffbc);
          uVar3 = getTag((Cache *)in_RDI,in_stack_ffffffffffffffbc);
          for (local_30 = 0; local_30 < *(uint *)(in_RDI->memory + 0xc); local_30 = local_30 + 1) {
            if ((*(long *)(in_RDI->memory[0xb][uVar4] + (long)(int)local_30 * 8) == -1) ||
               (*(ulong *)(in_RDI->memory[0xb][uVar4] + (long)(int)local_30 * 8) == (ulong)uVar3)) {
              bVar1 = false;
              break;
            }
          }
          if (bVar1) {
            if (in_RDI->memory[2] == (uint8_t **)0x0) {
              if (in_RCX != (int *)0x0) {
                *in_RCX = *in_RCX + 100;
              }
              *(int *)((long)in_RDI->memory + 0x7c) = *(int *)((long)in_RDI->memory + 0x7c) + 100;
              MemoryManager::setByteNoCache
                        (in_RDI,in_stack_ffffffffffffffbc,
                         (uint8_t)(in_stack_ffffffffffffffb8 >> 0x18));
            }
            else {
              *(int *)((long)in_RDI->memory + 0x7c) =
                   *(int *)(in_RDI->memory[2] + 8) + *(int *)((long)in_RDI->memory + 0x7c);
              setByte((Cache *)CONCAT44(in_ESI,uVar7),(uint32_t)((ulong)in_RCX >> 0x20),
                      (uint8_t)((ulong)in_RCX >> 0x18),
                      (uint32_t *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
            }
            getId((Cache *)in_RDI,in_stack_ffffffffffffffbc);
            MCTUpdate((Cache *)in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
            return;
          }
        }
        getId((Cache *)in_RDI,in_stack_ffffffffffffffbc);
        MCTUpdate((Cache *)in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      }
      vVar8 = (value_type)((uint)uVar7 >> 0x18);
      loadBlockFromLowerLevel(in_stack_00000080,in_stack_0000007c,in_stack_00000070);
      if ((*(byte *)((long)in_RDI->memory + 100) & 1) != 0) {
        preFetch(in_stack_00000080,in_stack_0000007c);
      }
      uVar2 = getBlockId((Cache *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         in_stack_ffffffffffffffb4);
      if (uVar2 == 0xffffffff) {
        fprintf(_stderr,"Error: data should in top level cache, but it seems not\n");
        exit(-1);
      }
      uVar3 = getOffset((Cache *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac);
      pvVar5 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                         ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)
                          (in_RDI->memory + 3),(long)(int)uVar2);
      pvVar5->dirty = true;
      PLRUUpdate((Cache *)in_RDI,uVar2);
      uVar4 = *(uint32_t *)in_RDI->memory;
      pvVar5 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                         ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)
                          (in_RDI->memory + 3),(long)(int)uVar2);
      pvVar5->last_reference = uVar4;
      pvVar5 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                         ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)
                          (in_RDI->memory + 3),(long)(int)uVar2);
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&pvVar5->data,(ulong)uVar3);
      *pvVar6 = vVar8;
    }
  }
  else {
    uVar3 = getOffset((Cache *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffac);
    *(int *)((long)in_RDI->memory + 0x74) = *(int *)((long)in_RDI->memory + 0x74) + 1;
    *(int *)((long)in_RDI->memory + 0x7c) =
         *(int *)(in_RDI->memory + 8) + *(int *)((long)in_RDI->memory + 0x7c);
    pvVar5 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                       ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI->memory + 3),
                        (long)(int)uVar2);
    pvVar5->dirty = true;
    PLRUUpdate((Cache *)in_RDI,uVar2);
    uVar4 = *(uint32_t *)in_RDI->memory;
    pvVar5 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                       ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI->memory + 3),
                        (long)(int)uVar2);
    pvVar5->last_reference = uVar4;
    vVar8 = (value_type)((uint)uVar7 >> 0x18);
    pvVar5 = std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                       ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI->memory + 3),
                        (long)(int)uVar2);
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&pvVar5->data,(ulong)uVar3);
    *pvVar6 = vVar8;
    if (((ulong)in_RDI->memory[0] & 0x100000000) == 0) {
      std::vector<Cache::Block,_std::allocator<Cache::Block>_>::operator[]
                ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)(in_RDI->memory + 3),
                 (long)(int)uVar2);
      writeBlockToLowerLevel(unaff_retaddr,(Block *)b,(uint32_t *)CONCAT44(in_ESI,uVar7));
    }
    if (in_RCX != (int *)0x0) {
      *in_RCX = *(int *)(in_RDI->memory + 8) + *in_RCX;
    }
  }
  return;
}

Assistant:

void Cache::setByte(uint32_t addr, uint8_t val, uint32_t *cycles) {
    this->reference_cnt++;
    this->statistics.write_cnt++;
    int block_id;
    if ((block_id = this->getBlockId(addr)) != -1) {
        //in cache
        uint32_t offset = this->getOffset(addr);
        this->statistics.hit_cnt++;
        this->statistics.cycle_cnt += this->policy.hit_latency;
        this->blocks[block_id].dirty = true;
        this->PLRUUpdate(block_id);
        this->blocks[block_id].last_reference = this->reference_cnt;
        this->blocks[block_id].data[offset] = val;
        if (!this->write_back) {
            this->writeBlockToLowerLevel(this->blocks[block_id], cycles);
//            this->statistics.cycle_cnt += this->policy.miss_latency;
        }
        if (cycles) {
            *cycles += this->policy.hit_latency;
        }
        return;
    }

    this->statistics.miss_cnt++;
//    this->statistics.cycle_cnt += this->policy.miss_latency;

    if (!this->write_allocate) {
        if (this->lower_cache == nullptr) {
            this->memory->setByteNoCache(addr, val);
            this->statistics.cycle_cnt += 100;
            if (cycles)
                *cycles += 100;
        } else {
            this->lower_cache->setByte(addr, val, cycles);
            if (cycles)
                this->statistics.cycle_cnt += *cycles;
        }
    } else {
        if (this->bypass) {
            if (this->cacheSetFull(getId(addr))) {
                bool next_level = true;
                uint32_t set_id = getId(addr);
                uint32_t tag = getTag(addr);
                for (int tmp = 0; tmp < this->mct_size; tmp++) {
                    if (mct[set_id][tmp] == (uint64_t) -1 || mct[set_id][tmp] == tag) {
                        next_level = false;
                        break;
                    }
                }
                if (next_level) {
                    if (this->lower_cache == nullptr) {
                        if (cycles)
                            *cycles += 100;
                        this->statistics.cycle_cnt += 100;
                        this->memory->setByteNoCache(addr, val);
                    } else {
                        this->statistics.cycle_cnt += this->lower_cache->policy.hit_latency;
                        this->lower_cache->setByte(addr, val, cycles);
                    }
                    MCTUpdate(getId(addr), addr);
                    return;
                }
            }
            MCTUpdate(getId(addr), addr);
        }
        this->loadBlockFromLowerLevel(addr, cycles);
        if (this->pre_fetch)
            preFetch(addr);
        if ((block_id = this->getBlockId(addr)) != -1) {
            uint32_t offset = this->getOffset(addr);
            this->blocks[block_id].dirty = true;
            this->PLRUUpdate(block_id);
            this->blocks[block_id].last_reference = this->reference_cnt;
            this->blocks[block_id].data[offset] = val;
//            if (cycles)
//                *cycles += this->policy.hit_latency;
            return;
        } else {
            fprintf(stderr, "Error: data should in top level cache, but it seems not\n");
            exit(-1);
        }
    }
}